

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

string * var_to_str<long,2ul>(string *__return_storage_ptr__,array<long,_2UL> *x)

{
  long lVar1;
  string sStack_48;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)__return_storage_ptr__,"[",(allocator<char> *)&sStack_48);
  lVar1 = 0;
  do {
    if (lVar1 == 1) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else if (lVar1 == 2) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    var_to_str<long>(&sStack_48,x->_M_elems);
    std::__cxx11::string::append((string *)__return_storage_ptr__);
    std::__cxx11::string::~string((string *)&sStack_48);
    lVar1 = lVar1 + 1;
    x = (array<long,_2UL> *)((long)x + 8);
  } while( true );
}

Assistant:

static std::string var_to_str(const std::array<T, N> & x) {
    std::string s = "[";
    for (size_t i = 0; i < N; i++) {
        if (i > 0) {
            s += ",";
        }
        s += var_to_str(x[i]);
    }
    s += "]";
    return s;
}